

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

bool __thiscall
matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
          (Id<mathiu::impl::Product> *this,Product *v)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>_&>
  _Var1;
  bool bVar2;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>_&>
  pIVar3;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>_&>
  pPVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  bool bVar8;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_25;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1179:45)>
  local_24;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_23;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
  local_22;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_21;
  
  pIVar3 = std::
           visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                     (&local_25,&this->mBlock);
  _Var1 = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::hasValue()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::hasValue()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::hasValue()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                    (&local_24,&(pIVar3->super_IdBlockBase<mathiu::impl::Product>).mVariant);
  if (_Var1) {
    pIVar3 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                       (&local_23,&this->mBlock);
    pPVar4 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                       (&local_22,&(pIVar3->super_IdBlockBase<mathiu::impl::Product>).mVariant);
    if ((pPVar4->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (v->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      p_Var5 = (pPVar4->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 = &(pPVar4->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header;
      bVar8 = (_Rb_tree_header *)p_Var5 == p_Var7;
      if (!bVar8) {
        p_Var6 = (v->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (bVar2 = mathiu::impl::equal((ExprPtr *)(p_Var5 + 1),(ExprPtr *)(p_Var6 + 1)), bVar2)
        {
          bVar2 = mathiu::impl::equal((ExprPtr *)&p_Var5[1]._M_left,(ExprPtr *)&p_Var6[1]._M_left);
          if (!bVar2) {
            return bVar8;
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          bVar8 = (_Rb_tree_header *)p_Var5 == p_Var7;
          if (bVar8) {
            return bVar8;
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        }
      }
    }
    else {
      bVar8 = false;
    }
  }
  else {
    pIVar3 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                       (&local_21,&this->mBlock);
    IdUtil<mathiu::impl::Product>::bindValue<mathiu::impl::Product_const&>
              (&(pIVar3->super_IdBlockBase<mathiu::impl::Product>).mVariant,v);
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }